

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.h
# Opt level: O2

string * Hpipe::to_string<char>(string *__return_storage_ptr__,char *val)

{
  ostringstream ss;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,*val);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( const T &val ) {
    std::ostringstream ss;
    ss << val;
    return ss.str();
}